

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

StorageClass __thiscall
spirv_cross::Compiler::get_expression_effective_storage_class(Compiler *this,uint32_t ptr)

{
  bool bVar1;
  SPIRVariable *pSVar2;
  SPIRExpression *pSVar3;
  SPIRType *pSVar4;
  size_type sVar5;
  StorageClass *pSVar6;
  uint32_t ptr_local;
  
  ptr_local = ptr;
  pSVar2 = maybe_get_backing_variable(this,ptr);
  if (((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr[ptr].type == TypeExpression) &&
     (pSVar3 = get<spirv_cross::SPIRExpression>(this,ptr), pSVar3->access_chain == false)) {
    sVar5 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->forced_temporaries)._M_h,&ptr_local);
    if (sVar5 == 0) {
      sVar5 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(this->forwarded_temporaries)._M_h,&ptr_local);
      bVar1 = sVar5 == 0;
      goto LAB_002e56ca;
    }
  }
  else {
    bVar1 = false;
LAB_002e56ca:
    if ((pSVar2 != (SPIRVariable *)0x0) && (!bVar1)) {
      if (pSVar2->storage != StorageClassUniform) {
        return pSVar2->storage;
      }
      pSVar4 = get<spirv_cross::SPIRType>(this,*(uint32_t *)&(pSVar2->super_IVariant).field_0xc);
      bVar1 = ParsedIR::has_decoration
                        (&this->ir,(ID)(pSVar4->super_IVariant).self.id,DecorationBufferBlock);
      if (bVar1) {
        return StorageClassStorageBuffer;
      }
      pSVar6 = &pSVar2->storage;
      goto LAB_002e572a;
    }
  }
  pSVar4 = expression_type(this,ptr_local);
  pSVar6 = &pSVar4->storage;
LAB_002e572a:
  return *pSVar6;
}

Assistant:

StorageClass Compiler::get_expression_effective_storage_class(uint32_t ptr)
{
	auto *var = maybe_get_backing_variable(ptr);

	// If the expression has been lowered to a temporary, we need to use the Generic storage class.
	// We're looking for the effective storage class of a given expression.
	// An access chain or forwarded OpLoads from such access chains
	// will generally have the storage class of the underlying variable, but if the load was not forwarded
	// we have lost any address space qualifiers.
	bool forced_temporary = ir.ids[ptr].get_type() == TypeExpression && !get<SPIRExpression>(ptr).access_chain &&
	                        (forced_temporaries.count(ptr) != 0 || forwarded_temporaries.count(ptr) == 0);

	if (var && !forced_temporary)
	{
		// Normalize SSBOs to StorageBuffer here.
		if (var->storage == StorageClassUniform &&
		    has_decoration(get<SPIRType>(var->basetype).self, DecorationBufferBlock))
			return StorageClassStorageBuffer;
		else
			return var->storage;
	}
	else
		return expression_type(ptr).storage;
}